

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

uint32 get32(stbi *s)

{
  int iVar1;
  int iVar2;
  uint32 z;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  iVar1 = get16((stbi *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  iVar2 = iVar1 << 0x10;
  iVar1 = get16((stbi *)CONCAT44(iVar1,iVar2));
  return iVar2 + iVar1;
}

Assistant:

static uint32 get32(stbi *s)
{
   uint32 z = get16(s);
   return (z << 16) + get16(s);
}